

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O3

bool __thiscall
CoreML::Specification::BiDirectionalLSTMLayerParams::MergePartialFromCodedStream
          (BiDirectionalLSTMLayerParams *this,CodedInputStream *input)

{
  byte *pbVar1;
  uint8 *puVar2;
  bool bVar3;
  int length;
  uint uVar4;
  int iVar5;
  uint32 uVar6;
  Type *this_00;
  Type *this_01;
  byte *pbVar7;
  LSTMParams *this_02;
  pair<int,_int> pVar8;
  byte bVar9;
  uint64 *puVar10;
  char cVar11;
  ulong uVar12;
  RepeatedPtrFieldBase *this_03;
  pair<unsigned_long,_bool> pVar13;
  
LAB_00495c5e:
  pbVar7 = input->buffer_;
  uVar6 = 0;
  if (pbVar7 < input->buffer_end_) {
    bVar9 = *pbVar7;
    uVar12 = (ulong)bVar9;
    pbVar1 = pbVar7 + 1;
    uVar4 = (uint)bVar9;
    if ((char)bVar9 < '\x01') {
      uVar6 = (uint)bVar9;
      if ((input->buffer_end_ <= pbVar1) || (uVar6 = uVar4, (~(uint)*pbVar1 & uVar4) < 0x80))
      goto LAB_00495f0d;
      uVar12 = (ulong)((uVar4 + (uint)*pbVar1 * 0x80) - 0x80);
      input->buffer_ = pbVar7 + 2;
    }
    else {
      input->buffer_ = pbVar1;
    }
    uVar12 = uVar12 | 0x100000000;
  }
  else {
LAB_00495f0d:
    uVar6 = google::protobuf::io::CodedInputStream::ReadTagFallback(input,uVar6);
    uVar12 = 0;
    if (uVar6 - 1 < 0x3fff) {
      uVar12 = 0x100000000;
    }
    uVar12 = uVar6 | uVar12;
  }
  uVar6 = (uint32)uVar12;
  if ((uVar12 & 0x100000000) != 0) {
    uVar4 = (uint)(uVar12 >> 3) & 0x1fffffff;
    cVar11 = (char)uVar12;
    if (10 < uVar4) {
      if (uVar4 == 0xb) {
        this_03 = &(this->activationsbackwardlstm_).super_RepeatedPtrFieldBase;
        if (cVar11 == 'Z') {
LAB_00495d9c:
          this_01 = google::protobuf::internal::RepeatedPtrFieldBase::
                    Add<google::protobuf::RepeatedPtrField<CoreML::Specification::ActivationParams>::TypeHandler>
                              (this_03,(Type *)0x0);
          puVar2 = input->buffer_;
          if ((puVar2 < input->buffer_end_) && (iVar5 = (int)(char)*puVar2, -1 < iVar5)) {
            input->buffer_ = puVar2 + 1;
          }
          else {
            iVar5 = google::protobuf::io::CodedInputStream::ReadVarintSizeAsIntFallback(input);
            if (iVar5 < 0) {
              return false;
            }
          }
          pVar8 = google::protobuf::io::CodedInputStream::IncrementRecursionDepthAndPushLimit
                            (input,iVar5);
          if ((long)pVar8 < 0) {
            return false;
          }
          bVar3 = ActivationParams::MergePartialFromCodedStream(this_01,input);
          goto LAB_00495ef9;
        }
        goto LAB_00495cbb;
      }
      if (uVar4 == 0xf) {
        if (cVar11 == 'z') {
          this_02 = this->params_;
          if (this_02 == (LSTMParams *)0x0) {
            this_02 = (LSTMParams *)operator_new(0x20);
            LSTMParams::LSTMParams(this_02);
            this->params_ = this_02;
          }
          puVar2 = input->buffer_;
          if ((puVar2 < input->buffer_end_) && (iVar5 = (int)(char)*puVar2, -1 < iVar5)) {
            input->buffer_ = puVar2 + 1;
          }
          else {
            iVar5 = google::protobuf::io::CodedInputStream::ReadVarintSizeAsIntFallback(input);
            if (iVar5 < 0) {
              return false;
            }
          }
          pVar8 = google::protobuf::io::CodedInputStream::IncrementRecursionDepthAndPushLimit
                            (input,iVar5);
          if ((long)pVar8 < 0) {
            return false;
          }
          bVar3 = LSTMParams::MergePartialFromCodedStream(this_02,input);
          goto LAB_00495ef9;
        }
        goto LAB_00495cbb;
      }
      if ((uVar4 != 0x14) || (cVar11 != -0x5e)) goto LAB_00495cbb;
      this_00 = google::protobuf::internal::RepeatedPtrFieldBase::
                Add<google::protobuf::RepeatedPtrField<CoreML::Specification::LSTMWeightParams>::TypeHandler>
                          (&(this->weightparams_).super_RepeatedPtrFieldBase,(Type *)0x0);
      puVar2 = input->buffer_;
      if ((puVar2 < input->buffer_end_) && (iVar5 = (int)(char)*puVar2, -1 < iVar5)) {
        input->buffer_ = puVar2 + 1;
      }
      else {
        iVar5 = google::protobuf::io::CodedInputStream::ReadVarintSizeAsIntFallback(input);
        if (iVar5 < 0) {
          return false;
        }
      }
      pVar8 = google::protobuf::io::CodedInputStream::IncrementRecursionDepthAndPushLimit
                        (input,iVar5);
      if ((long)pVar8 < 0) {
        return false;
      }
      bVar3 = LSTMWeightParams::MergePartialFromCodedStream(this_00,input);
LAB_00495ef9:
      if (bVar3 == false) {
        return false;
      }
      bVar3 = google::protobuf::io::CodedInputStream::DecrementRecursionDepthAndPopLimit
                        (input,pVar8.first);
      goto LAB_00495cdb;
    }
    if (uVar4 == 1) {
      if (cVar11 != '\b') goto LAB_00495cbb;
      pbVar7 = input->buffer_;
      if ((pbVar7 < input->buffer_end_) &&
         (bVar9 = *pbVar7, puVar10 = &this->inputvectorsize_, -1 < (char)bVar9)) {
LAB_00495def:
        *puVar10 = (ulong)bVar9;
        input->buffer_ = pbVar7 + 1;
      }
      else {
        pVar13 = google::protobuf::io::CodedInputStream::ReadVarint64Fallback(input);
        this->inputvectorsize_ = pVar13.first;
LAB_00495ec5:
        if (((undefined1  [16])pVar13 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
          return false;
        }
      }
      goto LAB_00495c5e;
    }
    if (uVar4 == 2) {
      if (cVar11 == '\x10') {
        pbVar7 = input->buffer_;
        if ((pbVar7 < input->buffer_end_) &&
           (bVar9 = *pbVar7, puVar10 = &this->outputvectorsize_, -1 < (char)bVar9))
        goto LAB_00495def;
        pVar13 = google::protobuf::io::CodedInputStream::ReadVarint64Fallback(input);
        this->outputvectorsize_ = pVar13.first;
        goto LAB_00495ec5;
      }
    }
    else if ((uVar4 == 10) &&
            (this_03 = &(this->activationsforwardlstm_).super_RepeatedPtrFieldBase, cVar11 == 'R'))
    goto LAB_00495d9c;
  }
LAB_00495cbb:
  if (uVar6 == 0) {
    return true;
  }
  if ((uVar6 & 7) == 4) {
    return true;
  }
  bVar3 = google::protobuf::internal::WireFormatLite::SkipField(input,uVar6);
LAB_00495cdb:
  if (bVar3 == false) {
    return false;
  }
  goto LAB_00495c5e;
}

Assistant:

bool BiDirectionalLSTMLayerParams::MergePartialFromCodedStream(
    ::google::protobuf::io::CodedInputStream* input) {
#define DO_(EXPRESSION) if (!GOOGLE_PREDICT_TRUE(EXPRESSION)) goto failure
  ::google::protobuf::uint32 tag;
  // @@protoc_insertion_point(parse_start:CoreML.Specification.BiDirectionalLSTMLayerParams)
  for (;;) {
    ::std::pair< ::google::protobuf::uint32, bool> p = input->ReadTagWithCutoffNoLastTag(16383u);
    tag = p.first;
    if (!p.second) goto handle_unusual;
    switch (::google::protobuf::internal::WireFormatLite::GetTagFieldNumber(tag)) {
      // uint64 inputVectorSize = 1;
      case 1: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(8u)) {

          DO_((::google::protobuf::internal::WireFormatLite::ReadPrimitive<
                   ::google::protobuf::uint64, ::google::protobuf::internal::WireFormatLite::TYPE_UINT64>(
                 input, &inputvectorsize_)));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // uint64 outputVectorSize = 2;
      case 2: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(16u)) {

          DO_((::google::protobuf::internal::WireFormatLite::ReadPrimitive<
                   ::google::protobuf::uint64, ::google::protobuf::internal::WireFormatLite::TYPE_UINT64>(
                 input, &outputvectorsize_)));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // repeated .CoreML.Specification.ActivationParams activationsForwardLSTM = 10;
      case 10: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(82u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadMessageNoVirtual(
                input, add_activationsforwardlstm()));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // repeated .CoreML.Specification.ActivationParams activationsBackwardLSTM = 11;
      case 11: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(90u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadMessageNoVirtual(
                input, add_activationsbackwardlstm()));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // .CoreML.Specification.LSTMParams params = 15;
      case 15: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(122u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadMessageNoVirtual(
               input, mutable_params()));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // repeated .CoreML.Specification.LSTMWeightParams weightParams = 20;
      case 20: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(162u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadMessageNoVirtual(
                input, add_weightparams()));
        } else {
          goto handle_unusual;
        }
        break;
      }

      default: {
      handle_unusual:
        if (tag == 0 ||
            ::google::protobuf::internal::WireFormatLite::GetTagWireType(tag) ==
            ::google::protobuf::internal::WireFormatLite::WIRETYPE_END_GROUP) {
          goto success;
        }
        DO_(::google::protobuf::internal::WireFormatLite::SkipField(input, tag));
        break;
      }
    }
  }
success:
  // @@protoc_insertion_point(parse_success:CoreML.Specification.BiDirectionalLSTMLayerParams)
  return true;
failure:
  // @@protoc_insertion_point(parse_failure:CoreML.Specification.BiDirectionalLSTMLayerParams)
  return false;
#undef DO_
}